

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  Module *this_00;
  bool bVar1;
  pointer pFVar2;
  pointer pTVar3;
  bool local_da;
  bool local_d9;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_d0 [2];
  Type *local_c0;
  Type *local_b8;
  Type *local_a8;
  Type *local_a0;
  Type *local_90;
  Type *local_88;
  Type *local_78;
  Type *local_70;
  unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> local_68;
  __single_object func_type;
  undefined1 local_40 [8];
  __single_object field;
  Type *result_types_local;
  Index result_count_local;
  Type *param_types_local;
  Index param_count_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
          )result_types;
  if (param_count < 0x3e9) {
    if (result_count < 0x3e9) {
      GetLocation((Location *)&func_type,this);
      std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_40);
      std::make_unique<wabt::FuncType>();
      pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                         (&local_68);
      std::vector<wabt::Type,std::allocator<wabt::Type>>::assign<wabt::Type*,void>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&pFVar2->sig,param_types,
                 param_types + param_count);
      pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                         (&local_68);
      std::vector<wabt::Type,std::allocator<wabt::Type>>::assign<wabt::Type*,void>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(pFVar2->sig).result_types,
                 (Type *)field._M_t.
                         super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                         .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl,
                 (Type *)((long)field._M_t.
                                super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                                .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl
                         + (ulong)result_count * 8));
      pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                         (&local_68);
      local_70 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin
                                   (&(pFVar2->sig).param_types);
      pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                         (&local_68);
      local_78 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end
                                   (&(pFVar2->sig).param_types);
      bVar1 = std::
              any_of<__gnu_cxx::__normal_iterator<wabt::Type*,std::vector<wabt::Type,std::allocator<wabt::Type>>>,wabt::(anonymous_namespace)::BinaryReaderIR::OnFuncType(unsigned_int,unsigned_int,wabt::Type*,unsigned_int,wabt::Type*)::__0>
                        (local_70,local_78);
      local_d9 = true;
      if (!bVar1) {
        pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                           (&local_68);
        local_88 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin
                                     (&(pFVar2->sig).result_types);
        pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                           (&local_68);
        local_90 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end
                                     (&(pFVar2->sig).result_types);
        local_d9 = std::
                   any_of<__gnu_cxx::__normal_iterator<wabt::Type*,std::vector<wabt::Type,std::allocator<wabt::Type>>>,wabt::(anonymous_namespace)::BinaryReaderIR::OnFuncType(unsigned_int,unsigned_int,wabt::Type*,unsigned_int,wabt::Type*)::__1>
                             (local_88,local_90);
      }
      (this->module_->features_used).simd =
           ((this->module_->features_used).simd & 1U) != 0 || local_d9 != false;
      pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                         (&local_68);
      local_a0 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin
                                   (&(pFVar2->sig).param_types);
      pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                         (&local_68);
      local_a8 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end
                                   (&(pFVar2->sig).param_types);
      bVar1 = std::
              any_of<__gnu_cxx::__normal_iterator<wabt::Type*,std::vector<wabt::Type,std::allocator<wabt::Type>>>,wabt::(anonymous_namespace)::BinaryReaderIR::OnFuncType(unsigned_int,unsigned_int,wabt::Type*,unsigned_int,wabt::Type*)::__2>
                        (local_a0,local_a8);
      local_da = true;
      if (!bVar1) {
        pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                           (&local_68);
        local_b8 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin
                                     (&(pFVar2->sig).result_types);
        pFVar2 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                           (&local_68);
        local_c0 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end
                                     (&(pFVar2->sig).result_types);
        local_da = std::
                   any_of<__gnu_cxx::__normal_iterator<wabt::Type*,std::vector<wabt::Type,std::allocator<wabt::Type>>>,wabt::(anonymous_namespace)::BinaryReaderIR::OnFuncType(unsigned_int,unsigned_int,wabt::Type*,unsigned_int,wabt::Type*)::__3>
                             (local_b8,local_c0);
      }
      (this->module_->features_used).exceptions =
           ((this->module_->features_used).exceptions & 1U) != 0 || local_da != false;
      pTVar3 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
               operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                           *)local_40);
      std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
                ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar3->type,
                 &local_68);
      this_00 = this->module_;
      std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
      unique_ptr(local_d0,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                           *)local_40);
      Module::AppendField(this_00,local_d0);
      std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
      ~unique_ptr(local_d0);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::~unique_ptr(&local_68);
      std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
      ~unique_ptr((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
                  local_40);
    }
    else {
      PrintError(this,"FuncType result count exceeds maximum value");
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"FuncType param count exceeds maximum value");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  if (param_count > kMaxFunctionParams) {
    PrintError("FuncType param count exceeds maximum value");
    return Result::Error;
  }

  if (result_count > kMaxFunctionResults) {
    PrintError("FuncType result count exceeds maximum value");
    return Result::Error;
  }

  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto func_type = std::make_unique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);

  module_->features_used.simd |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::V128; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::V128; });
  module_->features_used.exceptions |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::ExnRef; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::ExnRef; });

  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}